

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,char_writer f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  size_t size_1;
  char_type *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  basic_buffer<wchar_t> *c;
  int iVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  uVar11 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar10 = puVar2[2];
  uVar8 = uVar11 - size;
  if (uVar11 < size || uVar8 == 0) {
    uVar8 = size + lVar10;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
    }
    puVar2[2] = uVar8;
    pcVar7 = (char_type *)(lVar10 * 4 + puVar2[1]);
  }
  else {
    uVar9 = lVar10 + uVar11;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    auVar6 = _DAT_00138020;
    auVar5 = _DAT_00138010;
    auVar4 = _DAT_00137010;
    lVar3 = puVar2[1];
    pcVar7 = (char_type *)(lVar3 + lVar10 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar9 = uVar8 >> 1;
      if (1 < uVar8) {
        pcVar7 = pcVar7 + uVar9;
        uVar8 = uVar9 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar8;
        auVar22._0_8_ = uVar8;
        auVar22._12_4_ = (int)(uVar8 >> 0x20);
        lVar3 = lVar3 + lVar10 * 4;
        lVar10 = 0;
        auVar22 = auVar22 ^ _DAT_00137010;
        do {
          auVar19._8_4_ = (int)lVar10;
          auVar19._0_8_ = lVar10;
          auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar23 = (auVar19 | auVar6) ^ auVar4;
          iVar17 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar17 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar17 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar10 * 4) = wVar1;
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar10 * 4) = wVar1;
          }
          auVar19 = (auVar19 | auVar5) ^ auVar4;
          iVar24 = auVar19._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar19._0_4_ <= auVar22._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar10 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar10 * 4) = wVar1;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar8 - ((uint)(uVar9 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      *pcVar7 = f.value;
      auVar6 = _DAT_00138020;
      auVar5 = _DAT_00138010;
      auVar4 = _DAT_00137010;
      uVar11 = (uVar11 * 4 + (uVar9 + size) * -4) - 4;
      auVar23._8_4_ = (int)uVar11;
      auVar23._0_8_ = uVar11;
      auVar23._12_4_ = (int)(uVar11 >> 0x20);
      auVar14._0_8_ = uVar11 >> 2;
      auVar14._8_8_ = auVar23._8_8_ >> 2;
      uVar8 = 0;
      auVar14 = auVar14 ^ _DAT_00137010;
      do {
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar22 = (auVar20 | auVar6) ^ auVar4;
        iVar17 = auVar14._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar14._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          pcVar7[uVar8 + 1] = wVar1;
        }
        if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
            auVar22._12_4_ <= auVar14._12_4_) {
          pcVar7[uVar8 + 2] = wVar1;
        }
        auVar22 = (auVar20 | auVar5) ^ auVar4;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar14._0_4_)) {
          pcVar7[uVar8 + 3] = wVar1;
          pcVar7[uVar8 + 4] = wVar1;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
      return;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      pcVar7 = (char_type *)(lVar3 + lVar10 * 4);
      *pcVar7 = f.value;
      auVar6 = _DAT_00138020;
      auVar5 = _DAT_00138010;
      auVar4 = _DAT_00137010;
      uVar11 = (uVar11 * 4 + size * -4) - 4;
      auVar15._8_4_ = (int)uVar11;
      auVar15._0_8_ = uVar11;
      auVar15._12_4_ = (int)(uVar11 >> 0x20);
      auVar16._0_8_ = uVar11 >> 2;
      auVar16._8_8_ = auVar15._8_8_ >> 2;
      uVar8 = 0;
      auVar16 = auVar16 ^ _DAT_00137010;
      do {
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar22 = (auVar21 | auVar6) ^ auVar4;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar16._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          pcVar7[uVar8 + 1] = wVar1;
        }
        if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
            auVar22._12_4_ <= auVar16._12_4_) {
          pcVar7[uVar8 + 2] = wVar1;
        }
        auVar22 = (auVar21 | auVar5) ^ auVar4;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar16._0_4_)) {
          pcVar7[uVar8 + 3] = wVar1;
          pcVar7[uVar8 + 4] = wVar1;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
      return;
    }
    pcVar7 = pcVar7 + uVar8;
    uVar11 = (uVar11 * 4 + size * -4) - 4;
    auVar12._8_4_ = (int)uVar11;
    auVar12._0_8_ = uVar11;
    auVar12._12_4_ = (int)(uVar11 >> 0x20);
    auVar13._0_8_ = uVar11 >> 2;
    auVar13._8_8_ = auVar12._8_8_ >> 2;
    lVar3 = lVar3 + lVar10 * 4;
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_00137010;
    do {
      auVar18._8_4_ = (int)uVar8;
      auVar18._0_8_ = uVar8;
      auVar18._12_4_ = (int)(uVar8 >> 0x20);
      auVar22 = (auVar18 | auVar6) ^ auVar4;
      iVar17 = auVar13._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar17 && auVar13._0_4_ < auVar22._0_4_ ||
                  iVar17 < auVar22._4_4_) & 1)) {
        *(wchar_t *)(lVar3 + uVar8 * 4) = wVar1;
      }
      if ((auVar22._12_4_ != auVar13._12_4_ || auVar22._8_4_ <= auVar13._8_4_) &&
          auVar22._12_4_ <= auVar13._12_4_) {
        *(wchar_t *)(lVar3 + 4 + uVar8 * 4) = wVar1;
      }
      auVar22 = (auVar18 | auVar5) ^ auVar4;
      iVar24 = auVar22._4_4_;
      if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar13._0_4_)) {
        *(wchar_t *)(lVar3 + 8 + uVar8 * 4) = wVar1;
        *(wchar_t *)(lVar3 + 0xc + uVar8 * 4) = wVar1;
      }
      uVar8 = uVar8 + 4;
    } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
  }
  *pcVar7 = f.value;
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}